

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

Validity * __thiscall
capnp::compiler::CompilerMain::addOutput
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr spec)

{
  size_t __n;
  long lVar1;
  RemoveConst<capnp::compiler::CompilerMain::OutputDirective> **ppRVar2;
  OutputDirective *pOVar3;
  OutputDirective *pOVar4;
  RemoveConst<capnp::compiler::CompilerMain::OutputDirective> *pRVar5;
  String *pSVar6;
  undefined8 uVar7;
  int iVar8;
  void *pvVar9;
  undefined4 extraout_var;
  ulong uVar10;
  char *__s;
  ulong uVar11;
  size_t sVar12;
  char *__file;
  ulong uVar13;
  StringPtr pathText;
  stat stats;
  undefined1 local_168 [16];
  bool local_158;
  undefined7 uStack_157;
  String *local_150;
  size_t sStack_148;
  ArrayDisposer *local_140;
  Path local_138;
  Validity *local_118;
  char local_110;
  long local_108;
  undefined8 uStack_100;
  ArrayDisposer *local_f8;
  char local_f0;
  long local_e8;
  undefined8 uStack_e0;
  undefined8 *local_d8;
  undefined1 local_d0 [16];
  bool local_c0;
  String *local_b8;
  size_t sStack_b0;
  ArrayDisposer *local_a8;
  PathPtr local_40;
  
  __s = spec.content.ptr;
  __n = spec.content.size_ - 1;
  pvVar9 = memchr(__s,0x3a,__n);
  if (pvVar9 == (void *)0x0) {
    local_f0 = '\0';
    local_c0 = false;
    pOVar3 = (this->outputs).builder.endPtr;
    local_d0._0_8_ = __s;
    local_d0._8_8_ = __n;
    if ((this->outputs).builder.pos == pOVar3) {
      pOVar4 = (this->outputs).builder.ptr;
      sVar12 = 4;
      if (pOVar3 != pOVar4) {
        sVar12 = ((long)pOVar3 - (long)pOVar4 >> 4) * 0x5555555555555556;
      }
      kj::Vector<capnp::compiler::CompilerMain::OutputDirective>::setCapacity(&this->outputs,sVar12)
      ;
    }
    pRVar5 = (this->outputs).builder.pos;
    (pRVar5->name).ptr = (char *)local_d0._0_8_;
    (pRVar5->name).size_ = local_d0._8_8_;
    (pRVar5->dir).ptr.isSet = local_c0;
    if (local_c0 == true) {
      (pRVar5->dir).ptr.field_1.value.parts.ptr = local_b8;
      (pRVar5->dir).ptr.field_1.value.parts.size_ = sStack_b0;
      (pRVar5->dir).ptr.field_1.value.parts.disposer = local_a8;
      local_b8 = (String *)0x0;
      sStack_b0 = 0;
    }
    sVar12 = sStack_b0;
    pSVar6 = local_b8;
    ppRVar2 = &(this->outputs).builder.pos;
    *ppRVar2 = *ppRVar2 + 1;
    if ((local_c0 == true) && (local_b8 != (String *)0x0)) {
      local_b8 = (String *)0x0;
      sStack_b0 = 0;
      (**local_a8->_vptr_ArrayDisposer)
                (local_a8,pSVar6,0x18,sVar12,sVar12,
                 kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
    }
    uVar7 = uStack_e0;
    lVar1 = local_e8;
    if ((local_f0 == '\x01') && (local_e8 != 0)) {
      local_e8 = 0;
      uStack_e0 = 0;
      (**(code **)*local_d8)
                (local_d8,lVar1,0x18,uVar7,uVar7,
                 kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
    }
  }
  else {
    uVar11 = (long)pvVar9 - (long)__s;
    __file = (char *)((long)pvVar9 + 1);
    uVar13 = ~uVar11 + spec.content.size_;
    uVar10 = uVar11;
    local_118 = __return_storage_ptr__;
    if ((uVar11 == 1) && (((1 < uVar13 && (*__file == '/')) || ((1 < uVar13 && (*__file == '\\')))))
       ) {
      pvVar9 = memchr(__file,0x3a,uVar13 - 1);
      lVar1 = (long)pvVar9 + (1 - (long)__file);
      uVar10 = (long)pvVar9 + (2 - (long)__file);
      if (pvVar9 == (void *)0x0) {
        lVar1 = 0;
        uVar10 = uVar11;
      }
      __file = __file + lVar1;
      uVar13 = uVar13 - lVar1;
    }
    iVar8 = stat(__file,(stat *)local_d0);
    if ((iVar8 < 0) || (((uint)local_b8 & 0xf000) != 0x4000)) {
      kj::heapString((String *)local_168,"output location is inaccessible or is not a directory",
                     0x35);
      (local_118->errorMessage).ptr.isSet = true;
      (local_118->errorMessage).ptr.field_1.value.content.ptr = (char *)local_168._0_8_;
      (local_118->errorMessage).ptr.field_1.value.content.size_ = local_168._8_8_;
      (local_118->errorMessage).ptr.field_1.value.content.disposer =
           (ArrayDisposer *)CONCAT71(uStack_157,local_158);
      return local_118;
    }
    iVar8 = (*((this->disk).ptr)->_vptr_Filesystem[2])();
    local_40.parts.ptr = (String *)CONCAT44(extraout_var,iVar8);
    pathText.content.size_ = uVar13;
    pathText.content.ptr = __file;
    kj::PathPtr::eval(&local_138,&local_40,pathText);
    sStack_148 = local_138.parts.size_;
    local_150 = local_138.parts.ptr;
    local_110 = '\x01';
    local_f8 = local_138.parts.disposer;
    local_138.parts.ptr = (String *)0x0;
    local_138.parts.size_ = 0;
    local_158 = true;
    local_140 = local_138.parts.disposer;
    local_108 = 0;
    uStack_100 = 0;
    pOVar3 = (this->outputs).builder.endPtr;
    local_168._0_8_ = __s;
    local_168._8_8_ = uVar10;
    if ((this->outputs).builder.pos == pOVar3) {
      pOVar4 = (this->outputs).builder.ptr;
      sVar12 = 4;
      if (pOVar3 != pOVar4) {
        sVar12 = ((long)pOVar3 - (long)pOVar4 >> 4) * 0x5555555555555556;
      }
      kj::Vector<capnp::compiler::CompilerMain::OutputDirective>::setCapacity(&this->outputs,sVar12)
      ;
    }
    __return_storage_ptr__ = local_118;
    pRVar5 = (this->outputs).builder.pos;
    (pRVar5->name).ptr = (char *)local_168._0_8_;
    (pRVar5->name).size_ = local_168._8_8_;
    (pRVar5->dir).ptr.isSet = local_158;
    if (local_158 == true) {
      (pRVar5->dir).ptr.field_1.value.parts.ptr = local_150;
      (pRVar5->dir).ptr.field_1.value.parts.size_ = sStack_148;
      (pRVar5->dir).ptr.field_1.value.parts.disposer = local_140;
      local_150 = (String *)0x0;
      sStack_148 = 0;
    }
    sVar12 = sStack_148;
    pSVar6 = local_150;
    ppRVar2 = &(this->outputs).builder.pos;
    *ppRVar2 = *ppRVar2 + 1;
    if ((local_158 == true) && (local_150 != (String *)0x0)) {
      local_150 = (String *)0x0;
      sStack_148 = 0;
      (**local_140->_vptr_ArrayDisposer)
                (local_140,pSVar6,0x18,sVar12,sVar12,
                 kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
    }
    uVar7 = uStack_100;
    lVar1 = local_108;
    if ((local_110 == '\x01') && (local_108 != 0)) {
      local_108 = 0;
      uStack_100 = 0;
      (**local_f8->_vptr_ArrayDisposer)
                (local_f8,lVar1,0x18,uVar7,uVar7,
                 kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
    }
    sVar12 = local_138.parts.size_;
    pSVar6 = local_138.parts.ptr;
    if (local_138.parts.ptr != (String *)0x0) {
      local_138.parts.ptr = (String *)0x0;
      local_138.parts.size_ = 0;
      (**(local_138.parts.disposer)->_vptr_ArrayDisposer)
                (local_138.parts.disposer,pSVar6,0x18,sVar12,sVar12,
                 kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
    }
  }
  (__return_storage_ptr__->errorMessage).ptr.isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity addOutput(kj::StringPtr spec) {
    KJ_IF_MAYBE(split, spec.findFirst(':')) {
      kj::StringPtr dir = spec.slice(*split + 1);
      auto plugin = spec.slice(0, *split);

      if (*split == 1 && (dir.startsWith("/") || dir.startsWith("\\"))) {
        // The colon is the second character and is immediately followed by a slash or backslash.
        // So, the user passed something like `-o c:/foo`. Is this a request to run the C plugin
        // and output to `/foo`? Or are we on Windows, and is this a request to run the plugin
        // `c:/foo`?
        KJ_IF_MAYBE(split2, dir.findFirst(':')) {
          // There are two colons. The first ':' was the second char, and was followed by '/' or
          // '\', e.g.:
          //     capnp compile -o c:/foo.exe:bar
          //
          // In this case we can conclude that the second colon is actually meant to be the
          // plugin/location separator, and the first colon was simply signifying a drive letter.
          //
          // Proof by contradiction:
          // - Say that none of the colons were meant to be plugin/location separators; i.e. the
          //   whole argument is meant to be a plugin indicator and the location defaults to ".".
          //   -> In this case, the plugin path has two colons, which is not valid.
          //   -> CONTRADICTION
          // - Say that the first colon was meant to be the plugin/location separator.
          //   -> In this case, the second colon must be the drive letter separator for the
          //      output location.
          //   -> However, the output location begins with '/' or '\', which is not a drive letter.
          //   -> CONTRADICTION
          // - Say that there are more colons beyond the first two, and one of these is meant to
          //   be the plugin/location separator.
          //   -> In this case, the plugin path has two or more colons, which is not valid.
          //   -> CONTRADICTION
          //
          // We therefore conclude that the *second* colon is in fact the plugin/location separator.

          dir = dir.slice(*split2 + 1);
          plugin = spec.slice(0, *split2 + 2);
#if _WIN32
        } else {
          // The user wrote something like:
          //
          //     capnp compile -o c:/foo/bar
          //
          // What does this mean? It depends on what system we're on. On a Unix system, the above
          // clearly is a request to run the `capnpc-c` plugin (perhaps to output C code) and write
          // to the directory /foo/bar. But on Windows, absolute paths do not start with '/', and
          // the above is actually a request to run the plugin `c:/foo/bar`, outputting to the
          // current directory.

          outputs.add(OutputDirective { spec.asArray(), nullptr });
          return true;
#endif
        }
      }

      struct stat stats;
      if (stat(dir.cStr(), &stats) < 0 || !S_ISDIR(stats.st_mode)) {
        return "output location is inaccessible or is not a directory";
      }
      outputs.add(OutputDirective { plugin, disk->getCurrentPath().evalNative(dir) });
    }